

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

void QMetaType::registerNormalizedTypedef(QByteArray *normalizedTypeName,QMetaType metaType)

{
  byte bVar1;
  Entry *pEVar2;
  Type *this;
  long in_FS_OFFSET;
  Type *local_40;
  TryEmplaceResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (metaType.d_ptr != (QMetaTypeInterface *)0x0) {
    if ((char)QtGlobalStatic::
              Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::guard.
              _q_value.super___atomic_base<signed_char>._M_i < -1) {
      this = (Type *)0x0;
    }
    else {
      this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
             ::instance();
    }
    if (this != (Type *)0x0) {
      local_40 = this;
      if (((ulong)this & 1) == 0) {
        QReadWriteLock::lockForWrite(&this->lock);
        local_40 = (Type *)((ulong)this | 1);
      }
      QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::tryEmplace_impl<QByteArray_const&>
                (&local_38,(QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*> *)&this->aliases,
                 normalizedTypeName);
      pEVar2 = (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries;
      bVar1 = (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
              [(uint)local_38.iterator.i.bucket & 0x7f];
      if (*(long *)(pEVar2[bVar1].storage.data + 0x18) == 0) {
        *(QMetaTypeInterface **)(pEVar2[bVar1].storage.data + 0x18) = metaType.d_ptr;
        if (((ulong)local_40 & 1) != 0) {
          QReadWriteLock::unlock((QReadWriteLock *)((ulong)local_40 & 0xfffffffffffffffe));
        }
      }
      else if (((ulong)local_40 & 1) != 0) {
        QReadWriteLock::unlock((QReadWriteLock *)((ulong)local_40 & 0xfffffffffffffffe));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaType::registerNormalizedTypedef(const NS(QByteArray) & normalizedTypeName,
                                          QMetaType metaType)
{
    if (!metaType.isValid())
        return;
    if (auto reg = customTypeRegistry()) {
        QWriteLocker lock(&reg->lock);
        auto &al = reg->aliases[normalizedTypeName];
        if (al)
            return;
        al = metaType.d_ptr;
    }
}